

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::TagImport::~TagImport(TagImport *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pcVar3;
  
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__TagImport_001a41d8;
  pTVar2 = (this->tag).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->tag).decl.sig.result_types.
                                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pTVar2);
  }
  pTVar2 = (this->tag).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->tag).decl.sig.param_types.
                                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pTVar2);
  }
  Var::~Var(&(this->tag).decl.type_var);
  pcVar3 = (this->tag).name._M_dataplus._M_p;
  paVar1 = &(this->tag).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  Import::~Import((Import *)this);
  return;
}

Assistant:

explicit TagImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Tag>(), tag(name) {}